

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O1

void chunk_validate_objects(chunk_conflict *c)

{
  loc grid;
  object *poVar1;
  square *psVar2;
  monster *pmVar3;
  int y;
  int x;
  
  if (0 < c->height) {
    y = 0;
    do {
      if (0 < c->width) {
        x = 0;
        do {
          grid = (loc)loc(x,y);
          for (poVar1 = square_object(c,grid); poVar1 != (object *)0x0; poVar1 = poVar1->next) {
            if (poVar1->tval == '\0') {
              __assert_fail("obj->tval != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                            ,0x23f,"void chunk_validate_objects(struct chunk *)");
            }
          }
          psVar2 = square(c,grid);
          if (0 < psVar2->mon) {
            pmVar3 = square_monster(c,grid);
            for (poVar1 = pmVar3->held_obj; poVar1 != (object *)0x0; poVar1 = poVar1->next) {
              if (poVar1->tval == '\0') {
                __assert_fail("obj->tval != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                              ,0x244,"void chunk_validate_objects(struct chunk *)");
              }
            }
          }
          x = x + 1;
        } while (x < c->width);
      }
      y = y + 1;
    } while (y < c->height);
  }
  return;
}

Assistant:

void chunk_validate_objects(struct chunk *c) {
	int x, y;
	struct object *obj;

	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			for (obj = square_object(c, grid); obj; obj = obj->next)
				assert(obj->tval != 0);
			if (square(c, grid)->mon > 0) {
				struct monster *mon = square_monster(c, grid);
				if (mon->held_obj)
					for (obj = mon->held_obj; obj; obj = obj->next)
						assert(obj->tval != 0);
			}
		}
	}
}